

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  sqlite3_index_info *p;
  Index *p_00;
  Index *pIdx;
  sqlite3_index_info *pInfo;
  int i;
  WhereInfo *pWInfo_local;
  sqlite3 *db_local;
  
  if (pWInfo != (WhereInfo *)0x0) {
    for (pInfo._4_4_ = 0; pInfo._4_4_ < pWInfo->nLevel; pInfo._4_4_ = pInfo._4_4_ + 1) {
      p = pWInfo->a[pInfo._4_4_].pIdxInfo;
      if (p != (sqlite3_index_info *)0x0) {
        if (p->needToFreeIdxStr != 0) {
          sqlite3_free(p->idxStr);
        }
        sqlite3DbFree(db,p);
      }
      if (((pWInfo->a[pInfo._4_4_].plan.wsFlags & 0x20000000) != 0) &&
         (p_00 = pWInfo->a[pInfo._4_4_].plan.u.pIdx, p_00 != (Index *)0x0)) {
        sqlite3DbFree(db,p_00->zColAff);
        sqlite3DbFree(db,p_00);
      }
    }
    whereClauseClear(pWInfo->pWC);
    sqlite3DbFree(db,pWInfo);
  }
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  if( ALWAYS(pWInfo) ){
    int i;
    for(i=0; i<pWInfo->nLevel; i++){
      sqlite3_index_info *pInfo = pWInfo->a[i].pIdxInfo;
      if( pInfo ){
        /* assert( pInfo->needToFreeIdxStr==0 || db->mallocFailed ); */
        if( pInfo->needToFreeIdxStr ){
          sqlite3_free(pInfo->idxStr);
        }
        sqlite3DbFree(db, pInfo);
      }
      if( pWInfo->a[i].plan.wsFlags & WHERE_TEMP_INDEX ){
        Index *pIdx = pWInfo->a[i].plan.u.pIdx;
        if( pIdx ){
          sqlite3DbFree(db, pIdx->zColAff);
          sqlite3DbFree(db, pIdx);
        }
      }
    }
    whereClauseClear(pWInfo->pWC);
    sqlite3DbFree(db, pWInfo);
  }
}